

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8_int8.h
# Opt level: O0

void ncnn::padding_constant_pack8_int8_sse
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int64_t _v)

{
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  int x_4;
  int y_2;
  int x_3;
  int x_2;
  int x_1;
  int y_1;
  int x;
  int y;
  int64_t *outptr;
  int64_t *ptr;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long *local_30;
  long *local_28;
  
  local_28 = Mat::operator_cast_to_long_(in_RDI);
  local_30 = Mat::operator_cast_to_long_(in_RSI);
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < in_RSI->w; local_38 = local_38 + 1) {
      *local_30 = _x_4;
      local_30 = local_30 + 1;
    }
  }
  for (local_3c = 0; local_3c < in_RDI->h; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < in_R8D; local_40 = local_40 + 1) {
      *local_30 = _x_4;
      local_30 = local_30 + 1;
    }
    for (local_44 = 0; local_44 < in_RDI->w; local_44 = local_44 + 1) {
      *local_30 = *local_28;
      local_30 = local_30 + 1;
      local_28 = local_28 + 1;
    }
    for (local_48 = 0; local_48 < in_R9D; local_48 = local_48 + 1) {
      *local_30 = _x_4;
      local_30 = local_30 + 1;
    }
  }
  for (local_4c = 0; local_4c < in_ECX; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < in_RSI->w; local_50 = local_50 + 1) {
      *local_30 = _x_4;
      local_30 = local_30 + 1;
    }
  }
  return;
}

Assistant:

static void padding_constant_pack8_int8_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int64_t _v)
{
    const int64_t* ptr = src;
    int64_t* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        for (int x = 0; x < dst.w; x++)
        {
            *outptr++ = _v;
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            *outptr++ = _v;
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = _v;
        }
    }
    // fill bottom
    for (int y = 0; y < bottom; y++)
    {
        for (int x = 0; x < dst.w; x++)
        {
            *outptr++ = _v;
        }
    }
}